

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
S2Builder::Graph::GetInputEdgeOrder
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this,
          vector<int,_std::allocator<int>_> *input_ids)

{
  size_type __n;
  iterator iVar1;
  iterator iVar2;
  allocator<int> local_22;
  undefined1 local_21;
  anon_class_8_1_7b5baf63 local_20;
  vector<int,_std::allocator<int>_> *input_ids_local;
  Graph *this_local;
  vector<int,_std::allocator<int>_> *order;
  
  local_21 = 0;
  local_20.input_ids = input_ids;
  input_ids_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (Graph *)__return_storage_ptr__;
  __n = std::vector<int,_std::allocator<int>_>::size(input_ids);
  std::allocator<int>::allocator(&local_22);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_22);
  std::allocator<int>::~allocator(&local_22);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  iVar2 = std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,0);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  iVar2 = std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,S2Builder::Graph::GetInputEdgeOrder(std::vector<int,std::allocator<int>>const&)const::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             local_20);
  return __return_storage_ptr__;
}

Assistant:

vector<Graph::EdgeId> Graph::GetInputEdgeOrder(
    const vector<InputEdgeId>& input_ids) const {
  vector<EdgeId> order(input_ids.size());
  std::iota(order.begin(), order.end(), 0);
  std::sort(order.begin(), order.end(), [&input_ids](EdgeId a, EdgeId b) {
      // Comparison function ensures sort is stable.
      return make_pair(input_ids[a], a) < make_pair(input_ids[b], b);
    });
  return order;
}